

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O0

void nni_task_fini(nni_task *task)

{
  nni_task *task_local;
  
  nni_mtx_lock(&task->task_mtx);
  while (task->task_busy != 0) {
    nni_cv_wait(&task->task_cv);
  }
  nni_mtx_unlock(&task->task_mtx);
  nni_cv_fini(&task->task_cv);
  nni_mtx_fini(&task->task_mtx);
  return;
}

Assistant:

void
nni_task_fini(nni_task *task)
{
	nni_mtx_lock(&task->task_mtx);
	while (task->task_busy) {
		nni_cv_wait(&task->task_cv);
	}
	nni_mtx_unlock(&task->task_mtx);
	nni_cv_fini(&task->task_cv);
	nni_mtx_fini(&task->task_mtx);
}